

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

string * __thiscall
spvtools::val::ValidationState_t::getIdName_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  ostream *poVar1;
  stringstream local_1c8 [8];
  stringstream out;
  ostream aoStack_1b8 [376];
  undefined1 local_40 [8];
  string id_name;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  id_name.field_2._12_4_ = id;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &this->name_mapper_,id);
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar1 = std::operator<<(aoStack_1b8,"\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,id_name.field_2._12_4_);
  poVar1 = std::operator<<(poVar1,"[%");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  std::operator<<(poVar1,"]\'");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ValidationState_t::getIdName(uint32_t id) const {
  const std::string id_name = name_mapper_(id);

  std::stringstream out;
  out << "'" << id << "[%" << id_name << "]'";
  return out.str();
}